

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::maskValues(MutableCodePointTrie *this,uint32_t mask)

{
  int iVar1;
  int local_20;
  int local_1c;
  int32_t i_1;
  int32_t i;
  int32_t iLimit;
  uint32_t mask_local;
  MutableCodePointTrie *this_local;
  
  this->initialValue = mask & this->initialValue;
  this->errorValue = mask & this->errorValue;
  this->highValue = mask & this->highValue;
  iVar1 = this->highStart;
  for (local_1c = 0; local_1c < iVar1 >> 4; local_1c = local_1c + 1) {
    if (this->flags[local_1c] == '\0') {
      this->index[local_1c] = mask & this->index[local_1c];
    }
  }
  for (local_20 = 0; local_20 < this->dataLength; local_20 = local_20 + 1) {
    this->data[local_20] = mask & this->data[local_20];
  }
  return;
}

Assistant:

void MutableCodePointTrie::maskValues(uint32_t mask) {
    initialValue &= mask;
    errorValue &= mask;
    highValue &= mask;
    int32_t iLimit = highStart >> UCPTRIE_SHIFT_3;
    for (int32_t i = 0; i < iLimit; ++i) {
        if (flags[i] == ALL_SAME) {
            index[i] &= mask;
        }
    }
    for (int32_t i = 0; i < dataLength; ++i) {
        data[i] &= mask;
    }
}